

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsStrash.c
# Opt level: O0

void Abc_MfsConvertHopToAig_rec(Hop_Obj_t *pObj,Aig_Man_t *pMan)

{
  int iVar1;
  Hop_Obj_t *pHVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *p1;
  Aig_Man_t *pMan_local;
  Hop_Obj_t *pObj_local;
  
  iVar1 = Hop_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsStrash.c"
                  ,100,"void Abc_MfsConvertHopToAig_rec(Hop_Obj_t *, Aig_Man_t *)");
  }
  iVar1 = Hop_ObjIsNode(pObj);
  if ((iVar1 != 0) && (iVar1 = Hop_ObjIsMarkA(pObj), iVar1 == 0)) {
    pHVar2 = Hop_ObjFanin0(pObj);
    Abc_MfsConvertHopToAig_rec(pHVar2,pMan);
    pHVar2 = Hop_ObjFanin1(pObj);
    Abc_MfsConvertHopToAig_rec(pHVar2,pMan);
    pAVar3 = (Aig_Obj_t *)Hop_ObjChild0Copy(pObj);
    p1 = (Aig_Obj_t *)Hop_ObjChild1Copy(pObj);
    pAVar3 = Aig_And(pMan,pAVar3,p1);
    (pObj->field_0).pData = pAVar3;
    iVar1 = Hop_ObjIsMarkA(pObj);
    if (iVar1 != 0) {
      __assert_fail("!Hop_ObjIsMarkA(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsStrash.c"
                    ,0x6a,"void Abc_MfsConvertHopToAig_rec(Hop_Obj_t *, Aig_Man_t *)");
    }
    Hop_ObjSetMarkA(pObj);
  }
  return;
}

Assistant:

void Abc_MfsConvertHopToAig_rec( Hop_Obj_t * pObj, Aig_Man_t * pMan )
{
    assert( !Hop_IsComplement(pObj) );
    if ( !Hop_ObjIsNode(pObj) || Hop_ObjIsMarkA(pObj) )
        return;
    Abc_MfsConvertHopToAig_rec( Hop_ObjFanin0(pObj), pMan ); 
    Abc_MfsConvertHopToAig_rec( Hop_ObjFanin1(pObj), pMan );
    pObj->pData = Aig_And( pMan, (Aig_Obj_t *)Hop_ObjChild0Copy(pObj), (Aig_Obj_t *)Hop_ObjChild1Copy(pObj) ); 
    assert( !Hop_ObjIsMarkA(pObj) ); // loop detection
    Hop_ObjSetMarkA( pObj );
}